

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::FindFileByName
          (SimpleDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  bool bVar1;
  FileDescriptorProto *file;
  FileDescriptorProto *output_local;
  string *filename_local;
  SimpleDescriptorDatabase *this_local;
  
  file = DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::FindFile
                   (&this->index_,filename);
  bVar1 = MaybeCopy(this,file,output);
  return bVar1;
}

Assistant:

bool SimpleDescriptorDatabase::FindFileByName(
    const string& filename,
    FileDescriptorProto* output) {
  return MaybeCopy(index_.FindFile(filename), output);
}